

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::isMip(HighsLp *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int *in_RDI;
  HighsInt iCol;
  HighsInt integrality_size;
  int local_18;
  
  sVar1 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e));
  if ((int)sVar1 != 0) {
    for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
      pvVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e),
                          (long)local_18);
      if (*pvVar2 != kContinuous) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HighsLp::isMip() const {
  HighsInt integrality_size = this->integrality_.size();
  if (integrality_size) {
    assert(integrality_size == this->num_col_);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
      if (this->integrality_[iCol] != HighsVarType::kContinuous) return true;
  }
  return false;
}